

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

string * __thiscall
t_javame_generator::function_signature
          (string *__return_storage_ptr__,t_javame_generator *this,t_function *tfunction,
          string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  t_struct *ptVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  pointer pptVar11;
  string *result;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  string local_100;
  t_javame_generator *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_e0 = this;
  type_name_abi_cxx11_(&local_50,this,tfunction->returntype_,false,false,false);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = &local_a0;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar4[3];
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(prefix->_M_dataplus)._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(tfunction->name_)._M_dataplus._M_p);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar1 = &local_100.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_100.field_2._M_allocated_capacity = *puVar7;
    local_100.field_2._8_8_ = plVar4[3];
    local_100._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar7;
    local_100._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_100._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  argument_list_abi_cxx11_(&local_d0,local_e0,tfunction->arglist_,true);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    uVar10 = local_100.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_d0._M_string_length + local_100._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_100._M_string_length <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d0,0,(char *)0x0,(ulong)local_100._M_dataplus._M_p);
      goto LAB_00286790;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_d0._M_dataplus._M_p);
LAB_00286790:
  local_120 = &local_110;
  puVar9 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar9) {
    local_110 = *puVar9;
    uStack_108 = puVar5[3];
  }
  else {
    local_110 = *puVar9;
    local_120 = (undefined8 *)*puVar5;
  }
  local_118 = puVar5[1];
  *puVar5 = puVar9;
  puVar5[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_120);
  local_d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d8;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar3 = plVar4[3];
    local_d8->_M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ptVar2 = tfunction->xceptions_;
  pptVar11 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar11 !=
      (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      type_name_abi_cxx11_(&local_100,local_e0,(*pptVar11)->type_,false,false,false);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
      puVar9 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar9) {
        local_110 = *puVar9;
        uStack_108 = puVar5[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *puVar9;
        local_120 = (undefined8 *)*puVar5;
      }
      local_118 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_120);
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar1) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_javame_generator::function_signature(t_function* tfunction, string prefix) {
  t_type* ttype = tfunction->get_returntype();
  std::string result = type_name(ttype) + " " + prefix + tfunction->get_name() + "("
                       + argument_list(tfunction->get_arglist()) + ") throws ";
  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;
  for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
    result += type_name((*x_iter)->get_type(), false, false) + ", ";
  }
  result += "TException";
  return result;
}